

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initCSSData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  QMultiHash<char,_QLatin1String> local_3b58;
  QMultiHash<char,_QLatin1String> local_3b48;
  QMultiHash<char,_QLatin1String> local_3b38;
  QLatin1String local_3b28;
  char local_3b11;
  QLatin1String local_3b10;
  char local_3af9;
  QLatin1String local_3af8;
  char local_3ae1;
  QLatin1String local_3ae0;
  char local_3ac9;
  QLatin1String local_3ac8;
  char local_3ab1;
  QLatin1String local_3ab0;
  char local_3a99;
  QLatin1String local_3a98;
  char local_3a81;
  QLatin1String local_3a80;
  char local_3a69;
  QLatin1String local_3a68;
  char local_3a51;
  QLatin1String local_3a50;
  char local_3a39;
  QLatin1String local_3a38;
  char local_3a21;
  QLatin1String local_3a20;
  char local_3a09;
  QLatin1String local_3a08;
  char local_39f1;
  QLatin1String local_39f0;
  char local_39d9;
  QLatin1String local_39d8;
  char local_39c1;
  QLatin1String local_39c0;
  char local_39a9;
  QLatin1String local_39a8;
  char local_3991;
  QLatin1String local_3990;
  char local_3979;
  QLatin1String local_3978;
  char local_3961;
  QLatin1String local_3960;
  char local_3949;
  QLatin1String local_3948;
  char local_3931;
  QLatin1String local_3930;
  char local_3919;
  QLatin1String local_3918;
  char local_3901;
  QLatin1String local_3900;
  char local_38e9;
  QLatin1String local_38e8;
  char local_38d1;
  QLatin1String local_38d0;
  char local_38b9;
  QLatin1String local_38b8;
  char local_38a1;
  QLatin1String local_38a0;
  char local_3889;
  QLatin1String local_3888;
  char local_3871;
  QLatin1String local_3870;
  char local_3859;
  QLatin1String local_3858;
  char local_3841;
  QLatin1String local_3840;
  char local_3829;
  QLatin1String local_3828;
  char local_3811;
  QLatin1String local_3810;
  char local_37f9;
  QLatin1String local_37f8;
  char local_37e1;
  QLatin1String local_37e0;
  char local_37c9;
  QLatin1String local_37c8;
  char local_37b1;
  QLatin1String local_37b0;
  char local_3799;
  QLatin1String local_3798;
  char local_3781;
  QLatin1String local_3780;
  char local_3769;
  QLatin1String local_3768;
  char local_3751;
  QLatin1String local_3750;
  char local_3739;
  QLatin1String local_3738;
  char local_3721;
  QLatin1String local_3720;
  char local_3709;
  QLatin1String local_3708;
  char local_36f1;
  QLatin1String local_36f0;
  char local_36d9;
  QLatin1String local_36d8;
  char local_36c1;
  QLatin1String local_36c0;
  char local_36a9;
  QLatin1String local_36a8;
  char local_3691;
  QLatin1String local_3690;
  char local_3679;
  QLatin1String local_3678;
  char local_3661;
  QLatin1String local_3660;
  char local_3649;
  QLatin1String local_3648;
  char local_3631;
  QLatin1String local_3630;
  char local_3619;
  QLatin1String local_3618;
  char local_3601;
  QLatin1String local_3600;
  char local_35e9;
  QLatin1String local_35e8;
  char local_35d1;
  QLatin1String local_35d0;
  char local_35b9;
  QLatin1String local_35b8;
  char local_35a1;
  QLatin1String local_35a0;
  char local_3589;
  QLatin1String local_3588;
  char local_3571;
  QLatin1String local_3570;
  char local_3559;
  QLatin1String local_3558;
  char local_3541;
  QLatin1String local_3540;
  char local_3529;
  QLatin1String local_3528;
  char local_3511;
  QLatin1String local_3510;
  char local_34f9;
  QLatin1String local_34f8;
  char local_34e1;
  QLatin1String local_34e0;
  char local_34c9;
  QLatin1String local_34c8;
  char local_34b1;
  QLatin1String local_34b0;
  char local_3499;
  QLatin1String local_3498;
  char local_3481;
  QLatin1String local_3480;
  char local_3469;
  QLatin1String local_3468;
  char local_3451;
  QLatin1String local_3450;
  char local_3439;
  QLatin1String local_3438;
  char local_3421;
  QLatin1String local_3420;
  char local_3409;
  QLatin1String local_3408;
  char local_33f1;
  QLatin1String local_33f0;
  char local_33d9;
  QLatin1String local_33d8;
  char local_33c1;
  QLatin1String local_33c0;
  char local_33a9;
  QLatin1String local_33a8;
  char local_3391;
  QLatin1String local_3390;
  char local_3379;
  QLatin1String local_3378;
  char local_3361;
  QLatin1String local_3360;
  char local_3349;
  QLatin1String local_3348;
  char local_3331;
  QLatin1String local_3330;
  char local_3319;
  QLatin1String local_3318;
  char local_3301;
  QLatin1String local_3300;
  char local_32e9;
  QLatin1String local_32e8;
  char local_32d1;
  QLatin1String local_32d0;
  char local_32b9;
  QLatin1String local_32b8;
  char local_32a1;
  QLatin1String local_32a0;
  char local_3289;
  QLatin1String local_3288;
  char local_3271;
  QLatin1String local_3270;
  char local_3259;
  QLatin1String local_3258;
  char local_3241;
  QLatin1String local_3240;
  char local_3229;
  QLatin1String local_3228;
  char local_3211;
  QLatin1String local_3210;
  char local_31f9;
  QLatin1String local_31f8;
  char local_31e1;
  QLatin1String local_31e0;
  char local_31c9;
  QLatin1String local_31c8;
  char local_31b1;
  QLatin1String local_31b0;
  char local_3199;
  QLatin1String local_3198;
  char local_3181;
  QLatin1String local_3180;
  char local_3169;
  QLatin1String local_3168;
  char local_3151;
  QLatin1String local_3150;
  char local_3139;
  QLatin1String local_3138;
  char local_3121;
  QLatin1String local_3120;
  char local_3109;
  QLatin1String local_3108;
  char local_30f1;
  QLatin1String local_30f0;
  char local_30d9;
  QLatin1String local_30d8;
  char local_30c1;
  QLatin1String local_30c0;
  char local_30a9;
  QLatin1String local_30a8;
  char local_3091;
  QLatin1String local_3090;
  char local_3079;
  QLatin1String local_3078;
  char local_3061;
  QLatin1String local_3060;
  char local_3049;
  QLatin1String local_3048;
  char local_3031;
  QLatin1String local_3030;
  char local_3019;
  QLatin1String local_3018;
  char local_3001;
  QLatin1String local_3000;
  char local_2fe9;
  QLatin1String local_2fe8;
  char local_2fd1;
  QLatin1String local_2fd0;
  char local_2fb9;
  QLatin1String local_2fb8;
  char local_2fa1;
  QLatin1String local_2fa0;
  char local_2f89;
  QLatin1String local_2f88;
  char local_2f71;
  QLatin1String local_2f70;
  char local_2f59;
  QLatin1String local_2f58;
  char local_2f41;
  QLatin1String local_2f40;
  char local_2f29;
  QLatin1String local_2f28;
  char local_2f11;
  QLatin1String local_2f10;
  char local_2ef9;
  QLatin1String local_2ef8;
  char local_2ee1;
  QLatin1String local_2ee0;
  char local_2ec9;
  QLatin1String local_2ec8;
  char local_2eb1;
  QLatin1String local_2eb0;
  char local_2e99;
  QLatin1String local_2e98;
  char local_2e81;
  QLatin1String local_2e80;
  char local_2e69;
  QLatin1String local_2e68;
  char local_2e51;
  QLatin1String local_2e50;
  char local_2e39;
  QLatin1String local_2e38;
  char local_2e21;
  QLatin1String local_2e20;
  char local_2e09;
  QLatin1String local_2e08;
  char local_2df1;
  QLatin1String local_2df0;
  char local_2dd9;
  QLatin1String local_2dd8;
  char local_2dc1;
  QLatin1String local_2dc0;
  char local_2da9;
  QLatin1String local_2da8;
  char local_2d91;
  QLatin1String local_2d90;
  char local_2d79;
  QLatin1String local_2d78;
  char local_2d61;
  QLatin1String local_2d60;
  char local_2d49;
  QLatin1String local_2d48;
  char local_2d31;
  QLatin1String local_2d30;
  char local_2d19;
  QLatin1String local_2d18;
  char local_2d01;
  QLatin1String local_2d00;
  char local_2ce9;
  QLatin1String local_2ce8;
  char local_2cd1;
  QLatin1String local_2cd0;
  char local_2cb9;
  QLatin1String local_2cb8;
  char local_2ca1;
  QLatin1String local_2ca0;
  char local_2c89;
  QLatin1String local_2c88;
  char local_2c71;
  QLatin1String local_2c70;
  char local_2c59;
  QLatin1String local_2c58;
  char local_2c41;
  QLatin1String local_2c40;
  char local_2c29;
  QLatin1String local_2c28;
  char local_2c11;
  QLatin1String local_2c10;
  char local_2bf9;
  QLatin1String local_2bf8;
  char local_2be1;
  QLatin1String local_2be0;
  char local_2bc9;
  QLatin1String local_2bc8;
  char local_2bb1;
  QLatin1String local_2bb0;
  char local_2b99;
  QLatin1String local_2b98;
  char local_2b81;
  QLatin1String local_2b80;
  char local_2b69;
  QLatin1String local_2b68;
  char local_2b51;
  QLatin1String local_2b50;
  char local_2b39;
  QLatin1String local_2b38;
  char local_2b21;
  QLatin1String local_2b20;
  char local_2b09;
  QLatin1String local_2b08;
  char local_2af1;
  QLatin1String local_2af0;
  char local_2ad9;
  QLatin1String local_2ad8;
  char local_2ac1;
  QLatin1String local_2ac0;
  char local_2aa9;
  QLatin1String local_2aa8;
  char local_2a91;
  QLatin1String local_2a90;
  char local_2a79;
  QLatin1String local_2a78;
  char local_2a61;
  QLatin1String local_2a60;
  char local_2a49;
  QLatin1String local_2a48;
  char local_2a31;
  QLatin1String local_2a30;
  char local_2a19;
  QLatin1String local_2a18;
  char local_2a01;
  QLatin1String local_2a00;
  char local_29e9;
  QLatin1String local_29e8;
  char local_29d1;
  QLatin1String local_29d0;
  char local_29b9;
  QLatin1String local_29b8;
  char local_29a1;
  QLatin1String local_29a0;
  char local_2989;
  QLatin1String local_2988;
  char local_2971;
  QLatin1String local_2970;
  char local_2959;
  QLatin1String local_2958;
  char local_2941;
  QLatin1String local_2940;
  char local_2929;
  QLatin1String local_2928;
  char local_2911;
  QLatin1String local_2910;
  char local_28f9;
  QLatin1String local_28f8;
  char local_28e1;
  QLatin1String local_28e0;
  char local_28c9;
  QLatin1String local_28c8;
  char local_28b1;
  QLatin1String local_28b0;
  char local_2899;
  QLatin1String local_2898;
  char local_2881;
  QLatin1String local_2880;
  char local_2869;
  QLatin1String local_2868;
  char local_2851;
  QLatin1String local_2850;
  char local_2839;
  QLatin1String local_2838;
  char local_2821;
  QLatin1String local_2820;
  char local_2809;
  QLatin1String local_2808;
  char local_27f1;
  QLatin1String local_27f0;
  char local_27d9;
  QLatin1String local_27d8;
  char local_27c1;
  QLatin1String local_27c0;
  char local_27a9;
  QLatin1String local_27a8;
  char local_2791;
  QLatin1String local_2790;
  char local_2779;
  QLatin1String local_2778;
  char local_2761;
  QLatin1String local_2760;
  char local_2749;
  QLatin1String local_2748;
  char local_2731;
  QLatin1String local_2730;
  char local_2719;
  QLatin1String local_2718;
  char local_2701;
  QLatin1String local_2700;
  char local_26e9;
  QLatin1String local_26e8;
  char local_26d1;
  QLatin1String local_26d0;
  char local_26b9;
  QLatin1String local_26b8;
  char local_26a1;
  QLatin1String local_26a0;
  char local_2689;
  QLatin1String local_2688;
  char local_2671;
  QLatin1String local_2670;
  char local_2659;
  QLatin1String local_2658;
  char local_2641;
  QLatin1String local_2640;
  char local_2629;
  QLatin1String local_2628;
  char local_2611;
  QLatin1String local_2610;
  char local_25f9;
  QLatin1String local_25f8;
  char local_25e1;
  QLatin1String local_25e0;
  char local_25c9;
  QLatin1String local_25c8;
  char local_25b1;
  QLatin1String local_25b0;
  char local_2599;
  QLatin1String local_2598;
  char local_2581;
  QLatin1String local_2580;
  char local_2569;
  QLatin1String local_2568;
  char local_2551;
  QLatin1String local_2550;
  char local_2539;
  QLatin1String local_2538;
  char local_2521;
  QLatin1String local_2520;
  char local_2509;
  QLatin1String local_2508;
  char local_24f1;
  QLatin1String local_24f0;
  char local_24d9;
  QLatin1String local_24d8;
  char local_24c1;
  QLatin1String local_24c0;
  char local_24a9;
  QLatin1String local_24a8;
  char local_2491;
  QLatin1String local_2490;
  char local_2479;
  QLatin1String local_2478;
  char local_2461;
  QLatin1String local_2460;
  char local_2449;
  QLatin1String local_2448;
  char local_2431;
  QLatin1String local_2430;
  char local_2419;
  QLatin1String local_2418;
  char local_2401;
  QLatin1String local_2400;
  char local_23e9;
  QLatin1String local_23e8;
  char local_23d1;
  QLatin1String local_23d0;
  char local_23b9;
  QLatin1String local_23b8;
  char local_23a1;
  QLatin1String local_23a0;
  char local_2389;
  QLatin1String local_2388;
  char local_2371;
  QLatin1String local_2370;
  char local_2359;
  QLatin1String local_2358;
  char local_2341;
  QLatin1String local_2340;
  char local_2329;
  QLatin1String local_2328;
  char local_2311;
  QLatin1String local_2310;
  char local_22f9;
  QLatin1String local_22f8;
  char local_22e1;
  QLatin1String local_22e0;
  char local_22c9;
  QLatin1String local_22c8;
  char local_22b1;
  QLatin1String local_22b0;
  char local_2299;
  QLatin1String local_2298;
  char local_2281;
  QLatin1String local_2280;
  char local_2269;
  QLatin1String local_2268;
  char local_2251;
  QLatin1String local_2250;
  char local_2239;
  QLatin1String local_2238;
  char local_2221;
  QLatin1String local_2220;
  char local_2209;
  QLatin1String local_2208;
  char local_21f1;
  QLatin1String local_21f0;
  char local_21d9;
  QLatin1String local_21d8;
  char local_21c1;
  QLatin1String local_21c0;
  char local_21a9;
  QLatin1String local_21a8;
  char local_2191;
  QLatin1String local_2190;
  char local_2179;
  QLatin1String local_2178;
  char local_2161;
  QLatin1String local_2160;
  char local_2149;
  QLatin1String local_2148;
  char local_2131;
  QLatin1String local_2130;
  char local_2119;
  QLatin1String local_2118;
  char local_2101;
  QLatin1String local_2100;
  char local_20e9;
  QLatin1String local_20e8;
  char local_20d1;
  QLatin1String local_20d0;
  char local_20b9;
  QLatin1String local_20b8;
  char local_20a1;
  QLatin1String local_20a0;
  char local_2089;
  QLatin1String local_2088;
  char local_2071;
  QLatin1String local_2070;
  char local_2059;
  QLatin1String local_2058;
  char local_2041;
  QLatin1String local_2040;
  char local_2029;
  QLatin1String local_2028;
  char local_2011;
  QLatin1String local_2010;
  char local_1ff9;
  QLatin1String local_1ff8;
  char local_1fe1;
  QLatin1String local_1fe0;
  char local_1fc9;
  QLatin1String local_1fc8;
  char local_1fb1;
  QLatin1String local_1fb0;
  char local_1f99;
  QLatin1String local_1f98;
  char local_1f81;
  QLatin1String local_1f80;
  char local_1f69;
  QLatin1String local_1f68;
  char local_1f51;
  QLatin1String local_1f50;
  char local_1f39;
  QLatin1String local_1f38;
  char local_1f21;
  QLatin1String local_1f20;
  char local_1f09;
  QLatin1String local_1f08;
  char local_1ef1;
  QLatin1String local_1ef0;
  char local_1ed9;
  QLatin1String local_1ed8;
  char local_1ec1;
  QLatin1String local_1ec0;
  char local_1ea9;
  QLatin1String local_1ea8;
  char local_1e91;
  QLatin1String local_1e90;
  char local_1e79;
  QLatin1String local_1e78;
  char local_1e61;
  QLatin1String local_1e60;
  char local_1e49;
  QLatin1String local_1e48;
  char local_1e31;
  QLatin1String local_1e30;
  char local_1e19;
  QLatin1String local_1e18;
  char local_1e01;
  pair<char,_QLatin1String> local_1e00;
  pair<char,_QLatin1String> pStack_1de8;
  pair<char,_QLatin1String> pStack_1dd0;
  pair<char,_QLatin1String> pStack_1db8;
  pair<char,_QLatin1String> pStack_1da0;
  pair<char,_QLatin1String> pStack_1d88;
  pair<char,_QLatin1String> pStack_1d70;
  pair<char,_QLatin1String> pStack_1d58;
  pair<char,_QLatin1String> pStack_1d40;
  pair<char,_QLatin1String> pStack_1d28;
  pair<char,_QLatin1String> pStack_1d10;
  pair<char,_QLatin1String> pStack_1cf8;
  pair<char,_QLatin1String> pStack_1ce0;
  pair<char,_QLatin1String> pStack_1cc8;
  pair<char,_QLatin1String> pStack_1cb0;
  pair<char,_QLatin1String> pStack_1c98;
  pair<char,_QLatin1String> pStack_1c80;
  pair<char,_QLatin1String> pStack_1c68;
  pair<char,_QLatin1String> pStack_1c50;
  pair<char,_QLatin1String> pStack_1c38;
  pair<char,_QLatin1String> pStack_1c20;
  pair<char,_QLatin1String> pStack_1c08;
  pair<char,_QLatin1String> pStack_1bf0;
  pair<char,_QLatin1String> pStack_1bd8;
  pair<char,_QLatin1String> pStack_1bc0;
  pair<char,_QLatin1String> pStack_1ba8;
  pair<char,_QLatin1String> pStack_1b90;
  pair<char,_QLatin1String> pStack_1b78;
  pair<char,_QLatin1String> pStack_1b60;
  pair<char,_QLatin1String> pStack_1b48;
  pair<char,_QLatin1String> pStack_1b30;
  pair<char,_QLatin1String> pStack_1b18;
  pair<char,_QLatin1String> pStack_1b00;
  pair<char,_QLatin1String> pStack_1ae8;
  pair<char,_QLatin1String> pStack_1ad0;
  pair<char,_QLatin1String> pStack_1ab8;
  pair<char,_QLatin1String> pStack_1aa0;
  pair<char,_QLatin1String> pStack_1a88;
  pair<char,_QLatin1String> pStack_1a70;
  pair<char,_QLatin1String> pStack_1a58;
  pair<char,_QLatin1String> pStack_1a40;
  pair<char,_QLatin1String> pStack_1a28;
  pair<char,_QLatin1String> pStack_1a10;
  pair<char,_QLatin1String> pStack_19f8;
  pair<char,_QLatin1String> pStack_19e0;
  pair<char,_QLatin1String> pStack_19c8;
  pair<char,_QLatin1String> pStack_19b0;
  pair<char,_QLatin1String> pStack_1998;
  pair<char,_QLatin1String> pStack_1980;
  pair<char,_QLatin1String> pStack_1968;
  pair<char,_QLatin1String> pStack_1950;
  pair<char,_QLatin1String> pStack_1938;
  pair<char,_QLatin1String> pStack_1920;
  pair<char,_QLatin1String> pStack_1908;
  pair<char,_QLatin1String> pStack_18f0;
  pair<char,_QLatin1String> pStack_18d8;
  pair<char,_QLatin1String> pStack_18c0;
  pair<char,_QLatin1String> pStack_18a8;
  pair<char,_QLatin1String> pStack_1890;
  pair<char,_QLatin1String> pStack_1878;
  pair<char,_QLatin1String> pStack_1860;
  pair<char,_QLatin1String> pStack_1848;
  pair<char,_QLatin1String> pStack_1830;
  pair<char,_QLatin1String> pStack_1818;
  pair<char,_QLatin1String> pStack_1800;
  pair<char,_QLatin1String> pStack_17e8;
  pair<char,_QLatin1String> pStack_17d0;
  pair<char,_QLatin1String> pStack_17b8;
  pair<char,_QLatin1String> pStack_17a0;
  pair<char,_QLatin1String> pStack_1788;
  pair<char,_QLatin1String> pStack_1770;
  pair<char,_QLatin1String> pStack_1758;
  pair<char,_QLatin1String> pStack_1740;
  pair<char,_QLatin1String> pStack_1728;
  pair<char,_QLatin1String> pStack_1710;
  pair<char,_QLatin1String> pStack_16f8;
  pair<char,_QLatin1String> pStack_16e0;
  pair<char,_QLatin1String> pStack_16c8;
  pair<char,_QLatin1String> pStack_16b0;
  pair<char,_QLatin1String> pStack_1698;
  pair<char,_QLatin1String> pStack_1680;
  pair<char,_QLatin1String> pStack_1668;
  pair<char,_QLatin1String> pStack_1650;
  pair<char,_QLatin1String> pStack_1638;
  pair<char,_QLatin1String> pStack_1620;
  pair<char,_QLatin1String> pStack_1608;
  pair<char,_QLatin1String> pStack_15f0;
  pair<char,_QLatin1String> pStack_15d8;
  pair<char,_QLatin1String> pStack_15c0;
  pair<char,_QLatin1String> pStack_15a8;
  pair<char,_QLatin1String> pStack_1590;
  pair<char,_QLatin1String> pStack_1578;
  pair<char,_QLatin1String> pStack_1560;
  pair<char,_QLatin1String> pStack_1548;
  pair<char,_QLatin1String> pStack_1530;
  pair<char,_QLatin1String> pStack_1518;
  pair<char,_QLatin1String> pStack_1500;
  pair<char,_QLatin1String> pStack_14e8;
  pair<char,_QLatin1String> pStack_14d0;
  pair<char,_QLatin1String> pStack_14b8;
  pair<char,_QLatin1String> pStack_14a0;
  pair<char,_QLatin1String> pStack_1488;
  pair<char,_QLatin1String> pStack_1470;
  pair<char,_QLatin1String> pStack_1458;
  pair<char,_QLatin1String> pStack_1440;
  pair<char,_QLatin1String> pStack_1428;
  pair<char,_QLatin1String> pStack_1410;
  pair<char,_QLatin1String> pStack_13f8;
  pair<char,_QLatin1String> pStack_13e0;
  pair<char,_QLatin1String> pStack_13c8;
  pair<char,_QLatin1String> pStack_13b0;
  pair<char,_QLatin1String> pStack_1398;
  pair<char,_QLatin1String> pStack_1380;
  pair<char,_QLatin1String> pStack_1368;
  pair<char,_QLatin1String> pStack_1350;
  pair<char,_QLatin1String> pStack_1338;
  pair<char,_QLatin1String> pStack_1320;
  pair<char,_QLatin1String> pStack_1308;
  pair<char,_QLatin1String> pStack_12f0;
  pair<char,_QLatin1String> pStack_12d8;
  pair<char,_QLatin1String> pStack_12c0;
  pair<char,_QLatin1String> pStack_12a8;
  pair<char,_QLatin1String> pStack_1290;
  pair<char,_QLatin1String> pStack_1278;
  pair<char,_QLatin1String> pStack_1260;
  pair<char,_QLatin1String> pStack_1248;
  pair<char,_QLatin1String> pStack_1230;
  pair<char,_QLatin1String> pStack_1218;
  pair<char,_QLatin1String> pStack_1200;
  pair<char,_QLatin1String> pStack_11e8;
  pair<char,_QLatin1String> pStack_11d0;
  pair<char,_QLatin1String> pStack_11b8;
  pair<char,_QLatin1String> pStack_11a0;
  pair<char,_QLatin1String> pStack_1188;
  pair<char,_QLatin1String> pStack_1170;
  pair<char,_QLatin1String> pStack_1158;
  pair<char,_QLatin1String> pStack_1140;
  pair<char,_QLatin1String> pStack_1128;
  pair<char,_QLatin1String> pStack_1110;
  pair<char,_QLatin1String> pStack_10f8;
  pair<char,_QLatin1String> pStack_10e0;
  pair<char,_QLatin1String> pStack_10c8;
  pair<char,_QLatin1String> pStack_10b0;
  pair<char,_QLatin1String> pStack_1098;
  pair<char,_QLatin1String> pStack_1080;
  pair<char,_QLatin1String> pStack_1068;
  pair<char,_QLatin1String> pStack_1050;
  pair<char,_QLatin1String> pStack_1038;
  pair<char,_QLatin1String> pStack_1020;
  pair<char,_QLatin1String> pStack_1008;
  pair<char,_QLatin1String> pStack_ff0;
  pair<char,_QLatin1String> pStack_fd8;
  pair<char,_QLatin1String> pStack_fc0;
  pair<char,_QLatin1String> pStack_fa8;
  pair<char,_QLatin1String> pStack_f90;
  pair<char,_QLatin1String> pStack_f78;
  pair<char,_QLatin1String> pStack_f60;
  pair<char,_QLatin1String> pStack_f48;
  pair<char,_QLatin1String> pStack_f30;
  pair<char,_QLatin1String> pStack_f18;
  pair<char,_QLatin1String> pStack_f00;
  pair<char,_QLatin1String> pStack_ee8;
  pair<char,_QLatin1String> pStack_ed0;
  pair<char,_QLatin1String> pStack_eb8;
  pair<char,_QLatin1String> pStack_ea0;
  pair<char,_QLatin1String> pStack_e88;
  pair<char,_QLatin1String> pStack_e70;
  pair<char,_QLatin1String> pStack_e58;
  pair<char,_QLatin1String> pStack_e40;
  pair<char,_QLatin1String> pStack_e28;
  pair<char,_QLatin1String> pStack_e10;
  pair<char,_QLatin1String> pStack_df8;
  pair<char,_QLatin1String> pStack_de0;
  pair<char,_QLatin1String> pStack_dc8;
  pair<char,_QLatin1String> pStack_db0;
  pair<char,_QLatin1String> pStack_d98;
  pair<char,_QLatin1String> pStack_d80;
  pair<char,_QLatin1String> pStack_d68;
  pair<char,_QLatin1String> pStack_d50;
  pair<char,_QLatin1String> pStack_d38;
  pair<char,_QLatin1String> pStack_d20;
  pair<char,_QLatin1String> pStack_d08;
  pair<char,_QLatin1String> pStack_cf0;
  pair<char,_QLatin1String> pStack_cd8;
  pair<char,_QLatin1String> pStack_cc0;
  pair<char,_QLatin1String> pStack_ca8;
  pair<char,_QLatin1String> pStack_c90;
  pair<char,_QLatin1String> pStack_c78;
  pair<char,_QLatin1String> pStack_c60;
  pair<char,_QLatin1String> pStack_c48;
  pair<char,_QLatin1String> pStack_c30;
  pair<char,_QLatin1String> pStack_c18;
  pair<char,_QLatin1String> pStack_c00;
  pair<char,_QLatin1String> pStack_be8;
  pair<char,_QLatin1String> pStack_bd0;
  pair<char,_QLatin1String> pStack_bb8;
  pair<char,_QLatin1String> pStack_ba0;
  pair<char,_QLatin1String> pStack_b88;
  pair<char,_QLatin1String> pStack_b70;
  pair<char,_QLatin1String> pStack_b58;
  pair<char,_QLatin1String> pStack_b40;
  pair<char,_QLatin1String> pStack_b28;
  pair<char,_QLatin1String> pStack_b10;
  pair<char,_QLatin1String> pStack_af8;
  pair<char,_QLatin1String> pStack_ae0;
  pair<char,_QLatin1String> pStack_ac8;
  pair<char,_QLatin1String> pStack_ab0;
  pair<char,_QLatin1String> pStack_a98;
  pair<char,_QLatin1String> pStack_a80;
  pair<char,_QLatin1String> pStack_a68;
  pair<char,_QLatin1String> pStack_a50;
  pair<char,_QLatin1String> pStack_a38;
  pair<char,_QLatin1String> pStack_a20;
  pair<char,_QLatin1String> pStack_a08;
  pair<char,_QLatin1String> pStack_9f0;
  pair<char,_QLatin1String> pStack_9d8;
  pair<char,_QLatin1String> pStack_9c0;
  pair<char,_QLatin1String> pStack_9a8;
  pair<char,_QLatin1String> pStack_990;
  pair<char,_QLatin1String> pStack_978;
  pair<char,_QLatin1String> pStack_960;
  pair<char,_QLatin1String> pStack_948;
  pair<char,_QLatin1String> pStack_930;
  pair<char,_QLatin1String> pStack_918;
  pair<char,_QLatin1String> pStack_900;
  pair<char,_QLatin1String> pStack_8e8;
  pair<char,_QLatin1String> pStack_8d0;
  pair<char,_QLatin1String> pStack_8b8;
  pair<char,_QLatin1String> pStack_8a0;
  pair<char,_QLatin1String> pStack_888;
  pair<char,_QLatin1String> pStack_870;
  pair<char,_QLatin1String> pStack_858;
  pair<char,_QLatin1String> pStack_840;
  pair<char,_QLatin1String> pStack_828;
  pair<char,_QLatin1String> pStack_810;
  pair<char,_QLatin1String> pStack_7f8;
  pair<char,_QLatin1String> pStack_7e0;
  pair<char,_QLatin1String> pStack_7c8;
  pair<char,_QLatin1String> pStack_7b0;
  pair<char,_QLatin1String> pStack_798;
  pair<char,_QLatin1String> pStack_780;
  pair<char,_QLatin1String> pStack_768;
  pair<char,_QLatin1String> pStack_750;
  pair<char,_QLatin1String> pStack_738;
  pair<char,_QLatin1String> pStack_720;
  pair<char,_QLatin1String> pStack_708;
  pair<char,_QLatin1String> pStack_6f0;
  pair<char,_QLatin1String> pStack_6d8;
  pair<char,_QLatin1String> pStack_6c0;
  pair<char,_QLatin1String> pStack_6a8;
  pair<char,_QLatin1String> pStack_690;
  pair<char,_QLatin1String> pStack_678;
  pair<char,_QLatin1String> pStack_660;
  pair<char,_QLatin1String> pStack_648;
  pair<char,_QLatin1String> pStack_630;
  pair<char,_QLatin1String> pStack_618;
  pair<char,_QLatin1String> pStack_600;
  pair<char,_QLatin1String> pStack_5e8;
  pair<char,_QLatin1String> pStack_5d0;
  pair<char,_QLatin1String> pStack_5b8;
  pair<char,_QLatin1String> pStack_5a0;
  pair<char,_QLatin1String> pStack_588;
  pair<char,_QLatin1String> pStack_570;
  pair<char,_QLatin1String> pStack_558;
  pair<char,_QLatin1String> pStack_540;
  pair<char,_QLatin1String> pStack_528;
  pair<char,_QLatin1String> pStack_510;
  pair<char,_QLatin1String> pStack_4f8;
  pair<char,_QLatin1String> pStack_4e0;
  pair<char,_QLatin1String> pStack_4c8;
  pair<char,_QLatin1String> pStack_4b0;
  pair<char,_QLatin1String> pStack_498;
  pair<char,_QLatin1String> pStack_480;
  pair<char,_QLatin1String> pStack_468;
  pair<char,_QLatin1String> pStack_450;
  pair<char,_QLatin1String> pStack_438;
  pair<char,_QLatin1String> pStack_420;
  pair<char,_QLatin1String> pStack_408;
  pair<char,_QLatin1String> pStack_3f0;
  pair<char,_QLatin1String> pStack_3d8;
  pair<char,_QLatin1String> pStack_3c0;
  pair<char,_QLatin1String> pStack_3a8;
  pair<char,_QLatin1String> pStack_390;
  pair<char,_QLatin1String> pStack_378;
  pair<char,_QLatin1String> pStack_360;
  pair<char,_QLatin1String> pStack_348;
  pair<char,_QLatin1String> pStack_330;
  pair<char,_QLatin1String> pStack_318;
  pair<char,_QLatin1String> pStack_300;
  pair<char,_QLatin1String> pStack_2e8;
  pair<char,_QLatin1String> pStack_2d0;
  pair<char,_QLatin1String> pStack_2b8;
  pair<char,_QLatin1String> pStack_2a0;
  pair<char,_QLatin1String> pStack_288;
  pair<char,_QLatin1String> pStack_270;
  pair<char,_QLatin1String> pStack_258;
  pair<char,_QLatin1String> pStack_240;
  pair<char,_QLatin1String> pStack_228;
  pair<char,_QLatin1String> pStack_210;
  pair<char,_QLatin1String> pStack_1f8;
  pair<char,_QLatin1String> pStack_1e0;
  pair<char,_QLatin1String> pStack_1c8;
  pair<char,_QLatin1String> pStack_1b0;
  pair<char,_QLatin1String> pStack_198;
  pair<char,_QLatin1String> pStack_180;
  pair<char,_QLatin1String> pStack_168;
  pair<char,_QLatin1String> pStack_150;
  pair<char,_QLatin1String> pStack_138;
  pair<char,_QLatin1String> pStack_120;
  pair<char,_QLatin1String> pStack_108;
  pair<char,_QLatin1String> pStack_f0;
  iterator local_d8;
  undefined8 local_d0;
  QMultiHash<char,_QLatin1String> local_c8;
  QLatin1String local_b8;
  char local_a1;
  QLatin1String local_a0;
  char local_89;
  QLatin1String local_88;
  char local_71;
  pair<char,_QLatin1String> local_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_71 = 'i';
  QLatin1String::QLatin1String(&local_88,"important");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_70,&local_71,&local_88);
  local_89 = 'p';
  QLatin1String::QLatin1String(&local_a0,"px");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_58,&local_89,&local_a0);
  local_a1 = 'e';
  QLatin1String::QLatin1String(&local_b8,"em");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_40,&local_a1,&local_b8);
  local_28 = &local_70;
  local_20 = 3;
  list_00._M_len = 3;
  list_00._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&css_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  local_1e01 = 'a';
  QLatin1String::QLatin1String(&local_1e18,"align");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_1e00,&local_1e01,&local_1e18);
  local_1e19 = 'c';
  QLatin1String::QLatin1String(&local_1e30,"content");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1de8,&local_1e19,&local_1e30);
  local_1e31 = 'i';
  QLatin1String::QLatin1String(&local_1e48,"items");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1dd0,&local_1e31,&local_1e48);
  local_1e49 = 's';
  QLatin1String::QLatin1String(&local_1e60,"self");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1db8,&local_1e49,&local_1e60);
  local_1e61 = 'a';
  QLatin1String::QLatin1String(&local_1e78,"all");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1da0,&local_1e61,&local_1e78);
  local_1e79 = 'a';
  QLatin1String::QLatin1String(&local_1e90,"animation");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1d88,&local_1e79,&local_1e90);
  local_1e91 = 'd';
  QLatin1String::QLatin1String(&local_1ea8,"delay");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1d70,&local_1e91,&local_1ea8);
  local_1ea9 = 'd';
  QLatin1String::QLatin1String(&local_1ec0,"direction");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1d58,&local_1ea9,&local_1ec0);
  local_1ec1 = 'd';
  QLatin1String::QLatin1String(&local_1ed8,"duration");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1d40,&local_1ec1,&local_1ed8);
  local_1ed9 = 'f';
  QLatin1String::QLatin1String(&local_1ef0,"fill");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1d28,&local_1ed9,&local_1ef0);
  local_1ef1 = 'm';
  QLatin1String::QLatin1String(&local_1f08,"mode");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1d10,&local_1ef1,&local_1f08);
  local_1f09 = 'i';
  QLatin1String::QLatin1String(&local_1f20,"iteration");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1cf8,&local_1f09,&local_1f20);
  local_1f21 = 'c';
  QLatin1String::QLatin1String(&local_1f38,"count");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ce0,&local_1f21,&local_1f38);
  local_1f39 = 'n';
  QLatin1String::QLatin1String(&local_1f50,"name");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1cc8,&local_1f39,&local_1f50);
  local_1f51 = 'p';
  QLatin1String::QLatin1String(&local_1f68,"play");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1cb0,&local_1f51,&local_1f68);
  local_1f69 = 's';
  QLatin1String::QLatin1String(&local_1f80,"state");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c98,&local_1f69,&local_1f80);
  local_1f81 = 't';
  QLatin1String::QLatin1String(&local_1f98,"timing");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c80,&local_1f81,&local_1f98);
  local_1f99 = 'f';
  QLatin1String::QLatin1String(&local_1fb0,"function");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c68,&local_1f99,&local_1fb0);
  local_1fb1 = 'a';
  QLatin1String::QLatin1String(&local_1fc8,"azimuth");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c50,&local_1fb1,&local_1fc8);
  local_1fc9 = 'b';
  QLatin1String::QLatin1String(&local_1fe0,"backface");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c38,&local_1fc9,&local_1fe0);
  local_1fe1 = 'v';
  QLatin1String::QLatin1String(&local_1ff8,"visibility");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c20,&local_1fe1,&local_1ff8);
  local_1ff9 = 'a';
  QLatin1String::QLatin1String(&local_2010,"attachment");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c08,&local_1ff9,&local_2010);
  local_2011 = 'b';
  QLatin1String::QLatin1String(&local_2028,"blend");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1bf0,&local_2011,&local_2028);
  local_2029 = 'm';
  QLatin1String::QLatin1String(&local_2040,"mode");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1bd8,&local_2029,&local_2040);
  local_2041 = 'c';
  QLatin1String::QLatin1String(&local_2058,"clip");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1bc0,&local_2041,&local_2058);
  local_2059 = 'c';
  QLatin1String::QLatin1String(&local_2070,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ba8,&local_2059,&local_2070);
  local_2071 = 'i';
  QLatin1String::QLatin1String(&local_2088,"image");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b90,&local_2071,&local_2088);
  local_2089 = 'o';
  QLatin1String::QLatin1String(&local_20a0,"origin");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b78,&local_2089,&local_20a0);
  local_20a1 = 'p';
  QLatin1String::QLatin1String(&local_20b8,"position");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b60,&local_20a1,&local_20b8);
  local_20b9 = 'r';
  QLatin1String::QLatin1String(&local_20d0,"repeat");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b48,&local_20b9,&local_20d0);
  local_20d1 = 's';
  QLatin1String::QLatin1String(&local_20e8,"size");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b30,&local_20d1,&local_20e8);
  local_20e9 = 'b';
  QLatin1String::QLatin1String(&local_2100,"background");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b18,&local_20e9,&local_2100);
  local_2101 = 'b';
  QLatin1String::QLatin1String(&local_2118,"bleed");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b00,&local_2101,&local_2118);
  local_2119 = 'c';
  QLatin1String::QLatin1String(&local_2130,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ae8,&local_2119,&local_2130);
  local_2131 = 'r';
  QLatin1String::QLatin1String(&local_2148,"radius");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ad0,&local_2131,&local_2148);
  local_2149 = 'r';
  QLatin1String::QLatin1String(&local_2160,"radius");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ab8,&local_2149,&local_2160);
  local_2161 = 's';
  QLatin1String::QLatin1String(&local_2178,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1aa0,&local_2161,&local_2178);
  local_2179 = 'w';
  QLatin1String::QLatin1String(&local_2190,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a88,&local_2179,&local_2190);
  local_2191 = 'b';
  QLatin1String::QLatin1String(&local_21a8,"bottom");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a70,&local_2191,&local_21a8);
  local_21a9 = 'c';
  QLatin1String::QLatin1String(&local_21c0,"collapse");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a58,&local_21a9,&local_21c0);
  local_21c1 = 'c';
  QLatin1String::QLatin1String(&local_21d8,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a40,&local_21c1,&local_21d8);
  local_21d9 = 'i';
  QLatin1String::QLatin1String(&local_21f0,"image");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a28,&local_21d9,&local_21f0);
  local_21f1 = 'o';
  QLatin1String::QLatin1String(&local_2208,"outset");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a10,&local_21f1,&local_2208);
  local_2209 = 'r';
  QLatin1String::QLatin1String(&local_2220,"repeat");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_19f8,&local_2209,&local_2220);
  local_2221 = 's';
  QLatin1String::QLatin1String(&local_2238,"source");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_19e0,&local_2221,&local_2238);
  local_2239 = 's';
  QLatin1String::QLatin1String(&local_2250,"slice");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_19c8,&local_2239,&local_2250);
  local_2251 = 'w';
  QLatin1String::QLatin1String(&local_2268,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_19b0,&local_2251,&local_2268);
  local_2269 = 'c';
  QLatin1String::QLatin1String(&local_2280,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1998,&local_2269,&local_2280);
  local_2281 = 's';
  QLatin1String::QLatin1String(&local_2298,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1980,&local_2281,&local_2298);
  local_2299 = 'w';
  QLatin1String::QLatin1String(&local_22b0,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1968,&local_2299,&local_22b0);
  local_22b1 = 'l';
  QLatin1String::QLatin1String(&local_22c8,"left");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1950,&local_22b1,&local_22c8);
  local_22c9 = 'r';
  QLatin1String::QLatin1String(&local_22e0,"radius");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1938,&local_22c9,&local_22e0);
  local_22e1 = 'c';
  QLatin1String::QLatin1String(&local_22f8,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1920,&local_22e1,&local_22f8);
  local_22f9 = 's';
  QLatin1String::QLatin1String(&local_2310,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1908,&local_22f9,&local_2310);
  local_2311 = 'w';
  QLatin1String::QLatin1String(&local_2328,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_18f0,&local_2311,&local_2328);
  local_2329 = 'r';
  QLatin1String::QLatin1String(&local_2340,"right");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_18d8,&local_2329,&local_2340);
  local_2341 = 's';
  QLatin1String::QLatin1String(&local_2358,"spacing");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_18c0,&local_2341,&local_2358);
  local_2359 = 's';
  QLatin1String::QLatin1String(&local_2370,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_18a8,&local_2359,&local_2370);
  local_2371 = 'c';
  QLatin1String::QLatin1String(&local_2388,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1890,&local_2371,&local_2388);
  local_2389 = 'l';
  QLatin1String::QLatin1String(&local_23a0,"left");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1878,&local_2389,&local_23a0);
  local_23a1 = 'r';
  QLatin1String::QLatin1String(&local_23b8,"radius");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1860,&local_23a1,&local_23b8);
  local_23b9 = 'r';
  QLatin1String::QLatin1String(&local_23d0,"radius");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1848,&local_23b9,&local_23d0);
  local_23d1 = 's';
  QLatin1String::QLatin1String(&local_23e8,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1830,&local_23d1,&local_23e8);
  local_23e9 = 'w';
  QLatin1String::QLatin1String(&local_2400,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1818,&local_23e9,&local_2400);
  local_2401 = 't';
  QLatin1String::QLatin1String(&local_2418,"top");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1800,&local_2401,&local_2418);
  local_2419 = 'w';
  QLatin1String::QLatin1String(&local_2430,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_17e8,&local_2419,&local_2430);
  local_2431 = 'b';
  QLatin1String::QLatin1String(&local_2448,"border");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_17d0,&local_2431,&local_2448);
  local_2449 = 'b';
  QLatin1String::QLatin1String(&local_2460,"bottom");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_17b8,&local_2449,&local_2460);
  local_2461 = 'b';
  QLatin1String::QLatin1String(&local_2478,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_17a0,&local_2461,&local_2478);
  local_2479 = 'b';
  QLatin1String::QLatin1String(&local_2490,"box");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1788,&local_2479,&local_2490);
  local_2491 = 's';
  QLatin1String::QLatin1String(&local_24a8,"shadow");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1770,&local_2491,&local_24a8);
  local_24a9 = 'b';
  QLatin1String::QLatin1String(&local_24c0,"box");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1758,&local_24a9,&local_24c0);
  local_24c1 = 's';
  QLatin1String::QLatin1String(&local_24d8,"sizing");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1740,&local_24c1,&local_24d8);
  local_24d9 = 'a';
  QLatin1String::QLatin1String(&local_24f0,"after");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1728,&local_24d9,&local_24f0);
  local_24f1 = 'b';
  QLatin1String::QLatin1String(&local_2508,"before");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1710,&local_24f1,&local_2508);
  local_2509 = 'b';
  QLatin1String::QLatin1String(&local_2520,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_16f8,&local_2509,&local_2520);
  local_2521 = 'i';
  QLatin1String::QLatin1String(&local_2538,"inside");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_16e0,&local_2521,&local_2538);
  local_2539 = 'c';
  QLatin1String::QLatin1String(&local_2550,"caption");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_16c8,&local_2539,&local_2550);
  local_2551 = 's';
  QLatin1String::QLatin1String(&local_2568,"side");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_16b0,&local_2551,&local_2568);
  local_2569 = 'c';
  QLatin1String::QLatin1String(&local_2580,"caret");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1698,&local_2569,&local_2580);
  local_2581 = 'c';
  QLatin1String::QLatin1String(&local_2598,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1680,&local_2581,&local_2598);
  local_2599 = 'c';
  QLatin1String::QLatin1String(&local_25b0,"clear");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1668,&local_2599,&local_25b0);
  local_25b1 = 'c';
  QLatin1String::QLatin1String(&local_25c8,"clip");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1650,&local_25b1,&local_25c8);
  local_25c9 = 'c';
  QLatin1String::QLatin1String(&local_25e0,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1638,&local_25c9,&local_25e0);
  local_25e1 = 'c';
  QLatin1String::QLatin1String(&local_25f8,"columns");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1620,&local_25e1,&local_25f8);
  local_25f9 = 'c';
  QLatin1String::QLatin1String(&local_2610,"column");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1608,&local_25f9,&local_2610);
  local_2611 = 'c';
  QLatin1String::QLatin1String(&local_2628,"count");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_15f0,&local_2611,&local_2628);
  local_2629 = 'f';
  QLatin1String::QLatin1String(&local_2640,"fill");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_15d8,&local_2629,&local_2640);
  local_2641 = 'g';
  QLatin1String::QLatin1String(&local_2658,"gap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_15c0,&local_2641,&local_2658);
  local_2659 = 'r';
  QLatin1String::QLatin1String(&local_2670,"rule");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_15a8,&local_2659,&local_2670);
  local_2671 = 'c';
  QLatin1String::QLatin1String(&local_2688,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1590,&local_2671,&local_2688);
  local_2689 = 's';
  QLatin1String::QLatin1String(&local_26a0,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1578,&local_2689,&local_26a0);
  local_26a1 = 'w';
  QLatin1String::QLatin1String(&local_26b8,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1560,&local_26a1,&local_26b8);
  local_26b9 = 's';
  QLatin1String::QLatin1String(&local_26d0,"span");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1548,&local_26b9,&local_26d0);
  local_26d1 = 'w';
  QLatin1String::QLatin1String(&local_26e8,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1530,&local_26d1,&local_26e8);
  local_26e9 = 'c';
  QLatin1String::QLatin1String(&local_2700,"content");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1518,&local_26e9,&local_2700);
  local_2701 = 'i';
  QLatin1String::QLatin1String(&local_2718,"increment");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1500,&local_2701,&local_2718);
  local_2719 = 'c';
  QLatin1String::QLatin1String(&local_2730,"counter");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_14e8,&local_2719,&local_2730);
  local_2731 = 'r';
  QLatin1String::QLatin1String(&local_2748,"reset");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_14d0,&local_2731,&local_2748);
  local_2749 = 'a';
  QLatin1String::QLatin1String(&local_2760,"after");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_14b8,&local_2749,&local_2760);
  local_2761 = 'b';
  QLatin1String::QLatin1String(&local_2778,"before");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_14a0,&local_2761,&local_2778);
  local_2779 = 'c';
  QLatin1String::QLatin1String(&local_2790,"cue");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1488,&local_2779,&local_2790);
  local_2791 = 'c';
  QLatin1String::QLatin1String(&local_27a8,"cursor");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1470,&local_2791,&local_27a8);
  local_27a9 = 'd';
  QLatin1String::QLatin1String(&local_27c0,"direction");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1458,&local_27a9,&local_27c0);
  local_27c1 = 'd';
  QLatin1String::QLatin1String(&local_27d8,"display");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1440,&local_27c1,&local_27d8);
  local_27d9 = 'e';
  QLatin1String::QLatin1String(&local_27f0,"elevation");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1428,&local_27d9,&local_27f0);
  local_27f1 = 'e';
  QLatin1String::QLatin1String(&local_2808,"empty");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1410,&local_27f1,&local_2808);
  local_2809 = 'c';
  QLatin1String::QLatin1String(&local_2820,"cells");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13f8,&local_2809,&local_2820);
  local_2821 = 'f';
  QLatin1String::QLatin1String(&local_2838,"filter");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13e0,&local_2821,&local_2838);
  local_2839 = 'f';
  QLatin1String::QLatin1String(&local_2850,"flex");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13c8,&local_2839,&local_2850);
  local_2851 = 'b';
  QLatin1String::QLatin1String(&local_2868,"basis");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13b0,&local_2851,&local_2868);
  local_2869 = 'd';
  QLatin1String::QLatin1String(&local_2880,"direction");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1398,&local_2869,&local_2880);
  local_2881 = 'f';
  QLatin1String::QLatin1String(&local_2898,"feature");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1380,&local_2881,&local_2898);
  local_2899 = 's';
  QLatin1String::QLatin1String(&local_28b0,"settings");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1368,&local_2899,&local_28b0);
  local_28b1 = 'f';
  QLatin1String::QLatin1String(&local_28c8,"flex");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1350,&local_28b1,&local_28c8);
  local_28c9 = 'f';
  QLatin1String::QLatin1String(&local_28e0,"flow");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1338,&local_28c9,&local_28e0);
  local_28e1 = 'g';
  QLatin1String::QLatin1String(&local_28f8,"grow");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1320,&local_28e1,&local_28f8);
  local_28f9 = 's';
  QLatin1String::QLatin1String(&local_2910,"shrink");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1308,&local_28f9,&local_2910);
  local_2911 = 'w';
  QLatin1String::QLatin1String(&local_2928,"wrap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12f0,&local_2911,&local_2928);
  local_2929 = 'f';
  QLatin1String::QLatin1String(&local_2940,"float");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12d8,&local_2929,&local_2940);
  local_2941 = 'f';
  QLatin1String::QLatin1String(&local_2958,"family");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12c0,&local_2941,&local_2958);
  local_2959 = 'k';
  QLatin1String::QLatin1String(&local_2970,"kerning");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12a8,&local_2959,&local_2970);
  local_2971 = 'l';
  QLatin1String::QLatin1String(&local_2988,"language");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1290,&local_2971,&local_2988);
  local_2989 = 'o';
  QLatin1String::QLatin1String(&local_29a0,"override");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1278,&local_2989,&local_29a0);
  local_29a1 = 'a';
  QLatin1String::QLatin1String(&local_29b8,"adjust");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1260,&local_29a1,&local_29b8);
  local_29b9 = 's';
  QLatin1String::QLatin1String(&local_29d0,"size");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1248,&local_29b9,&local_29d0);
  local_29d1 = 's';
  QLatin1String::QLatin1String(&local_29e8,"stretch");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1230,&local_29d1,&local_29e8);
  local_29e9 = 's';
  QLatin1String::QLatin1String(&local_2a00,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1218,&local_29e9,&local_2a00);
  local_2a01 = 's';
  QLatin1String::QLatin1String(&local_2a18,"synthesis");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1200,&local_2a01,&local_2a18);
  local_2a19 = 'v';
  QLatin1String::QLatin1String(&local_2a30,"variant");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11e8,&local_2a19,&local_2a30);
  local_2a31 = 'a';
  QLatin1String::QLatin1String(&local_2a48,"alternates");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11d0,&local_2a31,&local_2a48);
  local_2a49 = 'c';
  QLatin1String::QLatin1String(&local_2a60,"caps");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11b8,&local_2a49,&local_2a60);
  local_2a61 = 'e';
  QLatin1String::QLatin1String(&local_2a78,"east");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11a0,&local_2a61,&local_2a78);
  local_2a79 = 'a';
  QLatin1String::QLatin1String(&local_2a90,"asian");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1188,&local_2a79,&local_2a90);
  local_2a91 = 'l';
  QLatin1String::QLatin1String(&local_2aa8,"ligatures");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1170,&local_2a91,&local_2aa8);
  local_2aa9 = 'n';
  QLatin1String::QLatin1String(&local_2ac0,"numeric");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1158,&local_2aa9,&local_2ac0);
  local_2ac1 = 'p';
  QLatin1String::QLatin1String(&local_2ad8,"position");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1140,&local_2ac1,&local_2ad8);
  local_2ad9 = 'w';
  QLatin1String::QLatin1String(&local_2af0,"weight");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1128,&local_2ad9,&local_2af0);
  local_2af1 = 'f';
  QLatin1String::QLatin1String(&local_2b08,"font");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1110,&local_2af1,&local_2b08);
  local_2b09 = 'a';
  QLatin1String::QLatin1String(&local_2b20,"area");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10f8,&local_2b09,&local_2b20);
  local_2b21 = 'a';
  QLatin1String::QLatin1String(&local_2b38,"auto");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10e0,&local_2b21,&local_2b38);
  local_2b39 = 'c';
  QLatin1String::QLatin1String(&local_2b50,"columns");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10c8,&local_2b39,&local_2b50);
  local_2b51 = 'f';
  QLatin1String::QLatin1String(&local_2b68,"flow");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10b0,&local_2b51,&local_2b68);
  local_2b69 = 'r';
  QLatin1String::QLatin1String(&local_2b80,"rows");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1098,&local_2b69,&local_2b80);
  local_2b81 = 'e';
  QLatin1String::QLatin1String(&local_2b98,"end");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1080,&local_2b81,&local_2b98);
  local_2b99 = 'g';
  QLatin1String::QLatin1String(&local_2bb0,"gap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1068,&local_2b99,&local_2bb0);
  local_2bb1 = 's';
  QLatin1String::QLatin1String(&local_2bc8,"start");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1050,&local_2bb1,&local_2bc8);
  local_2bc9 = 'c';
  QLatin1String::QLatin1String(&local_2be0,"column");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1038,&local_2bc9,&local_2be0);
  local_2be1 = 'g';
  QLatin1String::QLatin1String(&local_2bf8,"gap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1020,&local_2be1,&local_2bf8);
  local_2bf9 = 'e';
  QLatin1String::QLatin1String(&local_2c10,"end");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1008,&local_2bf9,&local_2c10);
  local_2c11 = 'g';
  QLatin1String::QLatin1String(&local_2c28,"gap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ff0,&local_2c11,&local_2c28);
  local_2c29 = 's';
  QLatin1String::QLatin1String(&local_2c40,"start");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fd8,&local_2c29,&local_2c40);
  local_2c41 = 'r';
  QLatin1String::QLatin1String(&local_2c58,"row");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fc0,&local_2c41,&local_2c58);
  local_2c59 = 'a';
  QLatin1String::QLatin1String(&local_2c70,"areas");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fa8,&local_2c59,&local_2c70);
  local_2c71 = 'c';
  QLatin1String::QLatin1String(&local_2c88,"columns");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f90,&local_2c71,&local_2c88);
  local_2c89 = 'r';
  QLatin1String::QLatin1String(&local_2ca0,"rows");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f78,&local_2c89,&local_2ca0);
  local_2ca1 = 't';
  QLatin1String::QLatin1String(&local_2cb8,"template");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f60,&local_2ca1,&local_2cb8);
  local_2cb9 = 'g';
  QLatin1String::QLatin1String(&local_2cd0,"grid");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f48,&local_2cb9,&local_2cd0);
  local_2cd1 = 'h';
  QLatin1String::QLatin1String(&local_2ce8,"hanging");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f30,&local_2cd1,&local_2ce8);
  local_2ce9 = 'p';
  QLatin1String::QLatin1String(&local_2d00,"punctuation");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f18,&local_2ce9,&local_2d00);
  local_2d01 = 'h';
  QLatin1String::QLatin1String(&local_2d18,"height");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f00,&local_2d01,&local_2d18);
  local_2d19 = 'h';
  QLatin1String::QLatin1String(&local_2d30,"hyphens");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ee8,&local_2d19,&local_2d30);
  local_2d31 = 'i';
  QLatin1String::QLatin1String(&local_2d48,"isolation");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ed0,&local_2d31,&local_2d48);
  local_2d49 = 'j';
  QLatin1String::QLatin1String(&local_2d60,"justify");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_eb8,&local_2d49,&local_2d60);
  local_2d61 = 'c';
  QLatin1String::QLatin1String(&local_2d78,"content");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ea0,&local_2d61,&local_2d78);
  local_2d79 = 'i';
  QLatin1String::QLatin1String(&local_2d90,"items");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e88,&local_2d79,&local_2d90);
  local_2d91 = 's';
  QLatin1String::QLatin1String(&local_2da8,"self");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e70,&local_2d91,&local_2da8);
  local_2da9 = 'l';
  QLatin1String::QLatin1String(&local_2dc0,"leftimage");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e58,&local_2da9,&local_2dc0);
  local_2dc1 = 'l';
  QLatin1String::QLatin1String(&local_2dd8,"letter");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e40,&local_2dc1,&local_2dd8);
  local_2dd9 = 's';
  QLatin1String::QLatin1String(&local_2df0,"spacing");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e28,&local_2dd9,&local_2df0);
  local_2df1 = 'b';
  QLatin1String::QLatin1String(&local_2e08,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e10,&local_2df1,&local_2e08);
  local_2e09 = 'l';
  QLatin1String::QLatin1String(&local_2e20,"line");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_df8,&local_2e09,&local_2e20);
  local_2e21 = 's';
  QLatin1String::QLatin1String(&local_2e38,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_de0,&local_2e21,&local_2e38);
  local_2e39 = 'i';
  QLatin1String::QLatin1String(&local_2e50,"image");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_dc8,&local_2e39,&local_2e50);
  local_2e51 = 's';
  QLatin1String::QLatin1String(&local_2e68,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_db0,&local_2e51,&local_2e68);
  local_2e69 = 'p';
  QLatin1String::QLatin1String(&local_2e80,"position");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d98,&local_2e69,&local_2e80);
  local_2e81 = 't';
  QLatin1String::QLatin1String(&local_2e98,"type");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d80,&local_2e81,&local_2e98);
  local_2e99 = 'l';
  QLatin1String::QLatin1String(&local_2eb0,"list");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d68,&local_2e99,&local_2eb0);
  local_2eb1 = 's';
  QLatin1String::QLatin1String(&local_2ec8,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d50,&local_2eb1,&local_2ec8);
  local_2ec9 = 'b';
  QLatin1String::QLatin1String(&local_2ee0,"bottom");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d38,&local_2ec9,&local_2ee0);
  local_2ee1 = 'l';
  QLatin1String::QLatin1String(&local_2ef8,"left");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d20,&local_2ee1,&local_2ef8);
  local_2ef9 = 'r';
  QLatin1String::QLatin1String(&local_2f10,"right");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d08,&local_2ef9,&local_2f10);
  local_2f11 = 't';
  QLatin1String::QLatin1String(&local_2f28,"top");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cf0,&local_2f11,&local_2f28);
  local_2f29 = 'm';
  QLatin1String::QLatin1String(&local_2f40,"margin");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cd8,&local_2f29,&local_2f40);
  local_2f41 = 'm';
  QLatin1String::QLatin1String(&local_2f58,"marker");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cc0,&local_2f41,&local_2f58);
  local_2f59 = 'o';
  QLatin1String::QLatin1String(&local_2f70,"offset");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ca8,&local_2f59,&local_2f70);
  local_2f71 = 'm';
  QLatin1String::QLatin1String(&local_2f88,"marks");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c90,&local_2f71,&local_2f88);
  local_2f89 = 'm';
  QLatin1String::QLatin1String(&local_2fa0,"max");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c78,&local_2f89,&local_2fa0);
  local_2fa1 = 'h';
  QLatin1String::QLatin1String(&local_2fb8,"height");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c60,&local_2fa1,&local_2fb8);
  local_2fb9 = 'w';
  QLatin1String::QLatin1String(&local_2fd0,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c48,&local_2fb9,&local_2fd0);
  local_2fd1 = 'm';
  QLatin1String::QLatin1String(&local_2fe8,"min");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c30,&local_2fd1,&local_2fe8);
  local_2fe9 = 'm';
  QLatin1String::QLatin1String(&local_3000,"mix");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c18,&local_2fe9,&local_3000);
  local_3001 = 'b';
  QLatin1String::QLatin1String(&local_3018,"blend");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c00,&local_3001,&local_3018);
  local_3019 = 'm';
  QLatin1String::QLatin1String(&local_3030,"mode");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_be8,&local_3019,&local_3030);
  local_3031 = 'n';
  QLatin1String::QLatin1String(&local_3048,"nav");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bd0,&local_3031,&local_3048);
  local_3049 = 'u';
  QLatin1String::QLatin1String(&local_3060,"up");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bb8,&local_3049,&local_3060);
  local_3061 = 'd';
  QLatin1String::QLatin1String(&local_3078,"down");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ba0,&local_3061,&local_3078);
  local_3079 = 'l';
  QLatin1String::QLatin1String(&local_3090,"left");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b88,&local_3079,&local_3090);
  local_3091 = 'r';
  QLatin1String::QLatin1String(&local_30a8,"right");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b70,&local_3091,&local_30a8);
  local_30a9 = 'o';
  QLatin1String::QLatin1String(&local_30c0,"opacity");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b58,&local_30a9,&local_30c0);
  local_30c1 = 'o';
  QLatin1String::QLatin1String(&local_30d8,"order");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b40,&local_30c1,&local_30d8);
  local_30d9 = 'o';
  QLatin1String::QLatin1String(&local_30f0,"orphans");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b28,&local_30d9,&local_30f0);
  local_30f1 = 'c';
  QLatin1String::QLatin1String(&local_3108,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b10,&local_30f1,&local_3108);
  local_3109 = 'o';
  QLatin1String::QLatin1String(&local_3120,"offset");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_af8,&local_3109,&local_3120);
  local_3121 = 's';
  QLatin1String::QLatin1String(&local_3138,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ae0,&local_3121,&local_3138);
  local_3139 = 'w';
  QLatin1String::QLatin1String(&local_3150,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ac8,&local_3139,&local_3150);
  local_3151 = 'o';
  QLatin1String::QLatin1String(&local_3168,"outline");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ab0,&local_3151,&local_3168);
  local_3169 = 'w';
  QLatin1String::QLatin1String(&local_3180,"wrap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a98,&local_3169,&local_3180);
  local_3181 = 'o';
  QLatin1String::QLatin1String(&local_3198,"overflow");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a80,&local_3181,&local_3198);
  local_3199 = 'b';
  QLatin1String::QLatin1String(&local_31b0,"bottom");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a68,&local_3199,&local_31b0);
  local_31b1 = 'l';
  QLatin1String::QLatin1String(&local_31c8,"left");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a50,&local_31b1,&local_31c8);
  local_31c9 = 'r';
  QLatin1String::QLatin1String(&local_31e0,"right");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a38,&local_31c9,&local_31e0);
  local_31e1 = 't';
  QLatin1String::QLatin1String(&local_31f8,"top");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a20,&local_31e1,&local_31f8);
  local_31f9 = 'p';
  QLatin1String::QLatin1String(&local_3210,"padding");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a08,&local_31f9,&local_3210);
  local_3211 = 'b';
  QLatin1String::QLatin1String(&local_3228,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9f0,&local_3211,&local_3228);
  local_3229 = 'a';
  QLatin1String::QLatin1String(&local_3240,"after");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9d8,&local_3229,&local_3240);
  local_3241 = 'b';
  QLatin1String::QLatin1String(&local_3258,"before");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9c0,&local_3241,&local_3258);
  local_3259 = 'i';
  QLatin1String::QLatin1String(&local_3270,"inside");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9a8,&local_3259,&local_3270);
  local_3271 = 'p';
  QLatin1String::QLatin1String(&local_3288,"page");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_990,&local_3271,&local_3288);
  local_3289 = 'a';
  QLatin1String::QLatin1String(&local_32a0,"after");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_978,&local_3289,&local_32a0);
  local_32a1 = 'b';
  QLatin1String::QLatin1String(&local_32b8,"before");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_960,&local_32a1,&local_32b8);
  local_32b9 = 'p';
  QLatin1String::QLatin1String(&local_32d0,"pause");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_948,&local_32b9,&local_32d0);
  local_32d1 = 'p';
  QLatin1String::QLatin1String(&local_32e8,"perspective");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_930,&local_32d1,&local_32e8);
  local_32e9 = 'o';
  QLatin1String::QLatin1String(&local_3300,"origin");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_918,&local_32e9,&local_3300);
  local_3301 = 'r';
  QLatin1String::QLatin1String(&local_3318,"range");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_900,&local_3301,&local_3318);
  local_3319 = 'p';
  QLatin1String::QLatin1String(&local_3330,"pitch");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8e8,&local_3319,&local_3330);
  local_3331 = 'c';
  QLatin1String::QLatin1String(&local_3348,"content");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8d0,&local_3331,&local_3348);
  local_3349 = 'i';
  QLatin1String::QLatin1String(&local_3360,"items");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8b8,&local_3349,&local_3360);
  local_3361 = 'p';
  QLatin1String::QLatin1String(&local_3378,"place");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8a0,&local_3361,&local_3378);
  local_3379 = 's';
  QLatin1String::QLatin1String(&local_3390,"self");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_888,&local_3379,&local_3390);
  local_3391 = 'p';
  QLatin1String::QLatin1String(&local_33a8,"play");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_870,&local_3391,&local_33a8);
  local_33a9 = 'd';
  QLatin1String::QLatin1String(&local_33c0,"during");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_858,&local_33a9,&local_33c0);
  local_33c1 = 'p';
  QLatin1String::QLatin1String(&local_33d8,"position");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_840,&local_33c1,&local_33d8);
  local_33d9 = 'q';
  QLatin1String::QLatin1String(&local_33f0,"quotes");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_828,&local_33d9,&local_33f0);
  local_33f1 = 'r';
  QLatin1String::QLatin1String(&local_3408,"resize");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_810,&local_33f1,&local_3408);
  local_3409 = 'r';
  QLatin1String::QLatin1String(&local_3420,"rest");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7f8,&local_3409,&local_3420);
  local_3421 = 'a';
  QLatin1String::QLatin1String(&local_3438,"after");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7e0,&local_3421,&local_3438);
  local_3439 = 'b';
  QLatin1String::QLatin1String(&local_3450,"before");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7c8,&local_3439,&local_3450);
  local_3451 = 'r';
  QLatin1String::QLatin1String(&local_3468,"rest");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7b0,&local_3451,&local_3468);
  local_3469 = 'r';
  QLatin1String::QLatin1String(&local_3480,"richness");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_798,&local_3469,&local_3480);
  local_3481 = 'r';
  QLatin1String::QLatin1String(&local_3498,"right");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_780,&local_3481,&local_3498);
  local_3499 = 's';
  QLatin1String::QLatin1String(&local_34b0,"size");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_768,&local_3499,&local_34b0);
  local_34b1 = 'h';
  QLatin1String::QLatin1String(&local_34c8,"header");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_750,&local_34b1,&local_34c8);
  local_34c9 = 'n';
  QLatin1String::QLatin1String(&local_34e0,"numeral");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_738,&local_34c9,&local_34e0);
  local_34e1 = 's';
  QLatin1String::QLatin1String(&local_34f8,"speak");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_720,&local_34e1,&local_34f8);
  local_34f9 = 'p';
  QLatin1String::QLatin1String(&local_3510,"punctuation");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_708,&local_34f9,&local_3510);
  local_3511 = 's';
  QLatin1String::QLatin1String(&local_3528,"speak");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6f0,&local_3511,&local_3528);
  local_3529 = 's';
  QLatin1String::QLatin1String(&local_3540,"speech");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6d8,&local_3529,&local_3540);
  local_3541 = 'r';
  QLatin1String::QLatin1String(&local_3558,"rate");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6c0,&local_3541,&local_3558);
  local_3559 = 's';
  QLatin1String::QLatin1String(&local_3570,"stress");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6a8,&local_3559,&local_3570);
  local_3571 = 't';
  QLatin1String::QLatin1String(&local_3588,"tab");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_690,&local_3571,&local_3588);
  local_3589 = 's';
  QLatin1String::QLatin1String(&local_35a0,"size");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_678,&local_3589,&local_35a0);
  local_35a1 = 't';
  QLatin1String::QLatin1String(&local_35b8,"table");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_660,&local_35a1,&local_35b8);
  local_35b9 = 'l';
  QLatin1String::QLatin1String(&local_35d0,"layout");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_648,&local_35b9,&local_35d0);
  local_35d1 = 't';
  QLatin1String::QLatin1String(&local_35e8,"text");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_630,&local_35d1,&local_35e8);
  local_35e9 = 'a';
  QLatin1String::QLatin1String(&local_3600,"align");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_618,&local_35e9,&local_3600);
  local_3601 = 'l';
  QLatin1String::QLatin1String(&local_3618,"last");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_600,&local_3601,&local_3618);
  local_3619 = 'd';
  QLatin1String::QLatin1String(&local_3630,"decoration");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5e8,&local_3619,&local_3630);
  local_3631 = 'c';
  QLatin1String::QLatin1String(&local_3648,"color");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5d0,&local_3631,&local_3648);
  local_3649 = 'l';
  QLatin1String::QLatin1String(&local_3660,"line");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5b8,&local_3649,&local_3660);
  local_3661 = 's';
  QLatin1String::QLatin1String(&local_3678,"skip");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5a0,&local_3661,&local_3678);
  local_3679 = 's';
  QLatin1String::QLatin1String(&local_3690,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_588,&local_3679,&local_3690);
  local_3691 = 'i';
  QLatin1String::QLatin1String(&local_36a8,"indent");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_570,&local_3691,&local_36a8);
  local_36a9 = 'o';
  QLatin1String::QLatin1String(&local_36c0,"overflow");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_558,&local_36a9,&local_36c0);
  local_36c1 = 's';
  QLatin1String::QLatin1String(&local_36d8,"shadow");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_540,&local_36c1,&local_36d8);
  local_36d9 = 't';
  QLatin1String::QLatin1String(&local_36f0,"transform");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_528,&local_36d9,&local_36f0);
  local_36f1 = 'u';
  QLatin1String::QLatin1String(&local_3708,"underline");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_510,&local_36f1,&local_3708);
  local_3709 = 'p';
  QLatin1String::QLatin1String(&local_3720,"position");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f8,&local_3709,&local_3720);
  local_3721 = 't';
  QLatin1String::QLatin1String(&local_3738,"top");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e0,&local_3721,&local_3738);
  local_3739 = 't';
  QLatin1String::QLatin1String(&local_3750,"transform");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c8,&local_3739,&local_3750);
  local_3751 = 'o';
  QLatin1String::QLatin1String(&local_3768,"origin");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b0,&local_3751,&local_3768);
  local_3769 = 's';
  QLatin1String::QLatin1String(&local_3780,"style");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_498,&local_3769,&local_3780);
  local_3781 = 't';
  QLatin1String::QLatin1String(&local_3798,"transition");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_480,&local_3781,&local_3798);
  local_3799 = 'd';
  QLatin1String::QLatin1String(&local_37b0,"delay");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_468,&local_3799,&local_37b0);
  local_37b1 = 'd';
  QLatin1String::QLatin1String(&local_37c8,"duration");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_450,&local_37b1,&local_37c8);
  local_37c9 = 'p';
  QLatin1String::QLatin1String(&local_37e0,"property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_438,&local_37c9,&local_37e0);
  local_37e1 = 't';
  QLatin1String::QLatin1String(&local_37f8,"timing");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_420,&local_37e1,&local_37f8);
  local_37f9 = 'f';
  QLatin1String::QLatin1String(&local_3810,"function");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_408,&local_37f9,&local_3810);
  local_3811 = 'u';
  QLatin1String::QLatin1String(&local_3828,"unicode");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3f0,&local_3811,&local_3828);
  local_3829 = 'b';
  QLatin1String::QLatin1String(&local_3840,"bidi");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3d8,&local_3829,&local_3840);
  local_3841 = 'v';
  QLatin1String::QLatin1String(&local_3858,"vertical");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3c0,&local_3841,&local_3858);
  local_3859 = 'a';
  QLatin1String::QLatin1String(&local_3870,"align");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3a8,&local_3859,&local_3870);
  local_3871 = 'v';
  QLatin1String::QLatin1String(&local_3888,"visibility");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_390,&local_3871,&local_3888);
  local_3889 = 'b';
  QLatin1String::QLatin1String(&local_38a0,"balance");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_378,&local_3889,&local_38a0);
  local_38a1 = 'd';
  QLatin1String::QLatin1String(&local_38b8,"duration");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_360,&local_38a1,&local_38b8);
  local_38b9 = 'f';
  QLatin1String::QLatin1String(&local_38d0,"family");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_348,&local_38b9,&local_38d0);
  local_38d1 = 'p';
  QLatin1String::QLatin1String(&local_38e8,"pitch");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_330,&local_38d1,&local_38e8);
  local_38e9 = 'r';
  QLatin1String::QLatin1String(&local_3900,"range");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_318,&local_38e9,&local_3900);
  local_3901 = 'r';
  QLatin1String::QLatin1String(&local_3918,"rate");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_300,&local_3901,&local_3918);
  local_3919 = 's';
  QLatin1String::QLatin1String(&local_3930,"stress");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e8,&local_3919,&local_3930);
  local_3931 = 'v';
  QLatin1String::QLatin1String(&local_3948,"volume");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2d0,&local_3931,&local_3948);
  local_3949 = 'v';
  QLatin1String::QLatin1String(&local_3960,"voice");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b8,&local_3949,&local_3960);
  local_3961 = 'v';
  QLatin1String::QLatin1String(&local_3978,"volume");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2a0,&local_3961,&local_3978);
  local_3979 = 'w';
  QLatin1String::QLatin1String(&local_3990,"white");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_288,&local_3979,&local_3990);
  local_3991 = 's';
  QLatin1String::QLatin1String(&local_39a8,"space");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_270,&local_3991,&local_39a8);
  local_39a9 = 'w';
  QLatin1String::QLatin1String(&local_39c0,"widows");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_258,&local_39a9,&local_39c0);
  local_39c1 = 'w';
  QLatin1String::QLatin1String(&local_39d8,"width");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_240,&local_39c1,&local_39d8);
  local_39d9 = 'w';
  QLatin1String::QLatin1String(&local_39f0,"will");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_228,&local_39d9,&local_39f0);
  local_39f1 = 'c';
  QLatin1String::QLatin1String(&local_3a08,"change");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_210,&local_39f1,&local_3a08);
  local_3a09 = 'w';
  QLatin1String::QLatin1String(&local_3a20,"word");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1f8,&local_3a09,&local_3a20);
  local_3a21 = 'b';
  QLatin1String::QLatin1String(&local_3a38,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1e0,&local_3a21,&local_3a38);
  local_3a39 = 's';
  QLatin1String::QLatin1String(&local_3a50,"spacing");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c8,&local_3a39,&local_3a50);
  local_3a51 = 'w';
  QLatin1String::QLatin1String(&local_3a68,"wrap");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b0,&local_3a51,&local_3a68);
  local_3a69 = 'x';
  QLatin1String::QLatin1String(&local_3a80,"x");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_198,&local_3a69,&local_3a80);
  local_3a81 = 'y';
  QLatin1String::QLatin1String(&local_3a98,"y");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_180,&local_3a81,&local_3a98);
  local_3a99 = 'z';
  QLatin1String::QLatin1String(&local_3ab0,"z");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_168,&local_3a99,&local_3ab0);
  local_3ab1 = 'i';
  QLatin1String::QLatin1String(&local_3ac8,"index");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_150,&local_3ab1,&local_3ac8);
  local_3ac9 = 'r';
  QLatin1String::QLatin1String(&local_3ae0,"rgb");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_138,&local_3ac9,&local_3ae0);
  local_3ae1 = 's';
  QLatin1String::QLatin1String(&local_3af8,"sans");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_120,&local_3ae1,&local_3af8);
  local_3af9 = 's';
  QLatin1String::QLatin1String(&local_3b10,"serif");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_108,&local_3af9,&local_3b10);
  local_3b11 = 'n';
  QLatin1String::QLatin1String(&local_3b28,"normal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f0,&local_3b11,&local_3b28);
  local_d8 = &local_1e00;
  local_d0 = 0x137;
  list._M_len = 0x137;
  list._M_array = local_d8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_c8,list);
  QMultiHash<char,_QLatin1String>::operator=(&css_types,&local_c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_c8);
  memset(&local_3b38,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_3b38);
  QMultiHash<char,_QLatin1String>::operator=(&css_literals,&local_3b38);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3b38);
  memset(&local_3b48,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_3b48);
  QMultiHash<char,_QLatin1String>::operator=(&css_builtin,&local_3b48);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3b48);
  memset(&local_3b58,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_3b58);
  QMultiHash<char,_QLatin1String>::operator=(&css_other,&local_3b58);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3b58);
  return;
}

Assistant:

void initCSSData() {
    css_keywords = {{'i', QLatin1String("important")},
                    {'p', QLatin1String("px")},
                    {'e', QLatin1String("em")}};

    css_types = {{'a', QLatin1String("align")},
                 {'c', QLatin1String("content")},
                 {'i', QLatin1String("items")},
                 {'s', QLatin1String("self")},
                 {'a', QLatin1String("all")},
                 {'a', QLatin1String("animation")},
                 {'d', QLatin1String("delay")},
                 {'d', QLatin1String("direction")},
                 {'d', QLatin1String("duration")},
                 {'f', QLatin1String("fill")},
                 {'m', QLatin1String("mode")},
                 {'i', QLatin1String("iteration")},
                 {'c', QLatin1String("count")},
                 {'n', QLatin1String("name")},
                 {'p', QLatin1String("play")},
                 {'s', QLatin1String("state")},
                 {'t', QLatin1String("timing")},
                 {'f', QLatin1String("function")},
                 {'a', QLatin1String("azimuth")},
                 {'b', QLatin1String("backface")},
                 {'v', QLatin1String("visibility")},
                 {'a', QLatin1String("attachment")},
                 {'b', QLatin1String("blend")},
                 {'m', QLatin1String("mode")},
                 {'c', QLatin1String("clip")},
                 {'c', QLatin1String("color")},
                 {'i', QLatin1String("image")},
                 {'o', QLatin1String("origin")},
                 {'p', QLatin1String("position")},
                 {'r', QLatin1String("repeat")},
                 {'s', QLatin1String("size")},
                 {'b', QLatin1String("background")},
                 {'b', QLatin1String("bleed")},
                 {'c', QLatin1String("color")},
                 {'r', QLatin1String("radius")},
                 {'r', QLatin1String("radius")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'b', QLatin1String("bottom")},
                 {'c', QLatin1String("collapse")},
                 {'c', QLatin1String("color")},
                 {'i', QLatin1String("image")},
                 {'o', QLatin1String("outset")},
                 {'r', QLatin1String("repeat")},
                 {'s', QLatin1String("source")},
                 {'s', QLatin1String("slice")},
                 {'w', QLatin1String("width")},
                 {'c', QLatin1String("color")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("radius")},
                 {'c', QLatin1String("color")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'r', QLatin1String("right")},
                 {'s', QLatin1String("spacing")},
                 {'s', QLatin1String("style")},
                 {'c', QLatin1String("color")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("radius")},
                 {'r', QLatin1String("radius")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'t', QLatin1String("top")},
                 {'w', QLatin1String("width")},
                 {'b', QLatin1String("border")},
                 {'b', QLatin1String("bottom")},
                 {'b', QLatin1String("break")},
                 {'b', QLatin1String("box")},
                 {'s', QLatin1String("shadow")},
                 {'b', QLatin1String("box")},
                 {'s', QLatin1String("sizing")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'b', QLatin1String("break")},
                 {'i', QLatin1String("inside")},
                 {'c', QLatin1String("caption")},
                 {'s', QLatin1String("side")},
                 {'c', QLatin1String("caret")},
                 {'c', QLatin1String("color")},
                 {'c', QLatin1String("clear")},
                 {'c', QLatin1String("clip")},
                 {'c', QLatin1String("color")},
                 {'c', QLatin1String("columns")},
                 {'c', QLatin1String("column")},
                 {'c', QLatin1String("count")},
                 {'f', QLatin1String("fill")},
                 {'g', QLatin1String("gap")},
                 {'r', QLatin1String("rule")},
                 {'c', QLatin1String("color")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'s', QLatin1String("span")},
                 {'w', QLatin1String("width")},
                 {'c', QLatin1String("content")},
                 {'i', QLatin1String("increment")},
                 {'c', QLatin1String("counter")},
                 {'r', QLatin1String("reset")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'c', QLatin1String("cue")},
                 {'c', QLatin1String("cursor")},
                 {'d', QLatin1String("direction")},
                 {'d', QLatin1String("display")},
                 {'e', QLatin1String("elevation")},
                 {'e', QLatin1String("empty")},
                 {'c', QLatin1String("cells")},
                 {'f', QLatin1String("filter")},
                 {'f', QLatin1String("flex")},
                 {'b', QLatin1String("basis")},
                 {'d', QLatin1String("direction")},
                 {'f', QLatin1String("feature")},
                 {'s', QLatin1String("settings")},
                 {'f', QLatin1String("flex")},
                 {'f', QLatin1String("flow")},
                 {'g', QLatin1String("grow")},
                 {'s', QLatin1String("shrink")},
                 {'w', QLatin1String("wrap")},
                 {'f', QLatin1String("float")},
                 {'f', QLatin1String("family")},
                 {'k', QLatin1String("kerning")},
                 {'l', QLatin1String("language")},
                 {'o', QLatin1String("override")},
                 {'a', QLatin1String("adjust")},
                 {'s', QLatin1String("size")},
                 {'s', QLatin1String("stretch")},
                 {'s', QLatin1String("style")},
                 {'s', QLatin1String("synthesis")},
                 {'v', QLatin1String("variant")},
                 {'a', QLatin1String("alternates")},
                 {'c', QLatin1String("caps")},
                 {'e', QLatin1String("east")},
                 {'a', QLatin1String("asian")},
                 {'l', QLatin1String("ligatures")},
                 {'n', QLatin1String("numeric")},
                 {'p', QLatin1String("position")},
                 {'w', QLatin1String("weight")},
                 {'f', QLatin1String("font")},
                 {'a', QLatin1String("area")},
                 {'a', QLatin1String("auto")},
                 {'c', QLatin1String("columns")},
                 {'f', QLatin1String("flow")},
                 {'r', QLatin1String("rows")},
                 {'e', QLatin1String("end")},
                 {'g', QLatin1String("gap")},
                 {'s', QLatin1String("start")},
                 {'c', QLatin1String("column")},
                 {'g', QLatin1String("gap")},
                 {'e', QLatin1String("end")},
                 {'g', QLatin1String("gap")},
                 {'s', QLatin1String("start")},
                 {'r', QLatin1String("row")},
                 {'a', QLatin1String("areas")},
                 {'c', QLatin1String("columns")},
                 {'r', QLatin1String("rows")},
                 {'t', QLatin1String("template")},
                 {'g', QLatin1String("grid")},
                 {'h', QLatin1String("hanging")},
                 {'p', QLatin1String("punctuation")},
                 {'h', QLatin1String("height")},
                 {'h', QLatin1String("hyphens")},
                 {'i', QLatin1String("isolation")},
                 {'j', QLatin1String("justify")},
                 {'c', QLatin1String("content")},
                 {'i', QLatin1String("items")},
                 {'s', QLatin1String("self")},
                 {'l', QLatin1String("leftimage")},
                 {'l', QLatin1String("letter")},
                 {'s', QLatin1String("spacing")},
                 {'b', QLatin1String("break")},
                 {'l', QLatin1String("line")},
                 {'s', QLatin1String("style")},
                 {'i', QLatin1String("image")},
                 {'s', QLatin1String("style")},
                 {'p', QLatin1String("position")},
                 {'t', QLatin1String("type")},
                 {'l', QLatin1String("list")},
                 {'s', QLatin1String("style")},
                 {'b', QLatin1String("bottom")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("right")},
                 {'t', QLatin1String("top")},
                 {'m', QLatin1String("margin")},
                 {'m', QLatin1String("marker")},
                 {'o', QLatin1String("offset")},
                 {'m', QLatin1String("marks")},
                 {'m', QLatin1String("max")},
                 {'h', QLatin1String("height")},
                 {'w', QLatin1String("width")},
                 {'m', QLatin1String("min")},
                 {'m', QLatin1String("mix")},
                 {'b', QLatin1String("blend")},
                 {'m', QLatin1String("mode")},
                 {'n', QLatin1String("nav")},
                 {'u', QLatin1String("up")},
                 {'d', QLatin1String("down")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("right")},
                 {'o', QLatin1String("opacity")},
                 {'o', QLatin1String("order")},
                 {'o', QLatin1String("orphans")},
                 {'c', QLatin1String("color")},
                 {'o', QLatin1String("offset")},
                 {'s', QLatin1String("style")},
                 {'w', QLatin1String("width")},
                 {'o', QLatin1String("outline")},
                 {'w', QLatin1String("wrap")},
                 {'o', QLatin1String("overflow")},
                 {'b', QLatin1String("bottom")},
                 {'l', QLatin1String("left")},
                 {'r', QLatin1String("right")},
                 {'t', QLatin1String("top")},
                 {'p', QLatin1String("padding")},
                 {'b', QLatin1String("break")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'i', QLatin1String("inside")},
                 {'p', QLatin1String("page")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'p', QLatin1String("pause")},
                 {'p', QLatin1String("perspective")},
                 {'o', QLatin1String("origin")},
                 {'r', QLatin1String("range")},
                 {'p', QLatin1String("pitch")},
                 {'c', QLatin1String("content")},
                 {'i', QLatin1String("items")},
                 {'p', QLatin1String("place")},
                 {'s', QLatin1String("self")},
                 {'p', QLatin1String("play")},
                 {'d', QLatin1String("during")},
                 {'p', QLatin1String("position")},
                 {'q', QLatin1String("quotes")},
                 {'r', QLatin1String("resize")},
                 {'r', QLatin1String("rest")},
                 {'a', QLatin1String("after")},
                 {'b', QLatin1String("before")},
                 {'r', QLatin1String("rest")},
                 {'r', QLatin1String("richness")},
                 {'r', QLatin1String("right")},
                 {'s', QLatin1String("size")},
                 {'h', QLatin1String("header")},
                 {'n', QLatin1String("numeral")},
                 {'s', QLatin1String("speak")},
                 {'p', QLatin1String("punctuation")},
                 {'s', QLatin1String("speak")},
                 {'s', QLatin1String("speech")},
                 {'r', QLatin1String("rate")},
                 {'s', QLatin1String("stress")},
                 {'t', QLatin1String("tab")},
                 {'s', QLatin1String("size")},
                 {'t', QLatin1String("table")},
                 {'l', QLatin1String("layout")},
                 {'t', QLatin1String("text")},
                 {'a', QLatin1String("align")},
                 {'l', QLatin1String("last")},
                 {'d', QLatin1String("decoration")},
                 {'c', QLatin1String("color")},
                 {'l', QLatin1String("line")},
                 {'s', QLatin1String("skip")},
                 {'s', QLatin1String("style")},
                 {'i', QLatin1String("indent")},
                 {'o', QLatin1String("overflow")},
                 {'s', QLatin1String("shadow")},
                 {'t', QLatin1String("transform")},
                 {'u', QLatin1String("underline")},
                 {'p', QLatin1String("position")},
                 {'t', QLatin1String("top")},
                 {'t', QLatin1String("transform")},
                 {'o', QLatin1String("origin")},
                 {'s', QLatin1String("style")},
                 {'t', QLatin1String("transition")},
                 {'d', QLatin1String("delay")},
                 {'d', QLatin1String("duration")},
                 {'p', QLatin1String("property")},
                 {'t', QLatin1String("timing")},
                 {'f', QLatin1String("function")},
                 {'u', QLatin1String("unicode")},
                 {'b', QLatin1String("bidi")},
                 {'v', QLatin1String("vertical")},
                 {'a', QLatin1String("align")},
                 {'v', QLatin1String("visibility")},
                 {'b', QLatin1String("balance")},
                 {'d', QLatin1String("duration")},
                 {'f', QLatin1String("family")},
                 {'p', QLatin1String("pitch")},
                 {'r', QLatin1String("range")},
                 {'r', QLatin1String("rate")},
                 {'s', QLatin1String("stress")},
                 {'v', QLatin1String("volume")},
                 {'v', QLatin1String("voice")},
                 {'v', QLatin1String("volume")},
                 {'w', QLatin1String("white")},
                 {'s', QLatin1String("space")},
                 {'w', QLatin1String("widows")},
                 {'w', QLatin1String("width")},
                 {'w', QLatin1String("will")},
                 {'c', QLatin1String("change")},
                 {'w', QLatin1String("word")},
                 {'b', QLatin1String("break")},
                 {'s', QLatin1String("spacing")},
                 {'w', QLatin1String("wrap")},
                 {'x', QLatin1String("x")},
                 {'y', QLatin1String("y")},
                 {'z', QLatin1String("z")},
                 {'i', QLatin1String("index")},
                 {'r', QLatin1String("rgb")},
                 {'s', QLatin1String("sans")},
                 {'s', QLatin1String("serif")},
                 {'n', QLatin1String("normal")}};

    css_literals = {};

    css_builtin = {};

    css_other = {};
}